

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O3

BasicTypeKind
(anonymous_namespace)::selectTypeForValue<6ul>
          (PlatformOptions *platfOpts,unsigned_long_long v,BasicTypeKind (*candidates) [6])

{
  unsigned_long_long uVar1;
  ostream *poVar2;
  ArithmeticIntegerType arithIntTy;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = false;
  uVar3 = 0;
  do {
    arithIntTy = (*candidates)[uVar3];
    if (Bool < arithIntTy) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                 ,0x5a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2c9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<empty message>",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      arithIntTy = Int_S;
      break;
    }
    uVar1 = psy::C::PlatformOptions::maxValueOf(platfOpts,arithIntTy);
    if (v <= uVar1) break;
    bVar4 = 3 < uVar3;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 5);
  if (bVar4) {
    arithIntTy = (*candidates)[5];
  }
  return arithIntTy;
}

Assistant:

BasicTypeKind selectTypeForValue(
        const PlatformOptions& platfOpts,
        unsigned long long v,
        BasicTypeKind (&candidates)[N])
{
    for (size_t i = 0; i < N - 1; ++i) {
        unsigned long long max;
        BasicTypeKind basicTyK = candidates[i];
        switch (basicTyK) {
            case BasicTypeKind::Char:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Char);
                break;
            case BasicTypeKind::Char_S:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Char_S);
                break;
            case BasicTypeKind::Char_U:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Char_U);
                break;
            case BasicTypeKind::Short_S:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Short_S);
                break;
            case BasicTypeKind::Short_U:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Short_U);
                break;
            case BasicTypeKind::Int_S:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Int_S);
                break;
            case BasicTypeKind::Int_U:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Int_U);
                break;
            case BasicTypeKind::Long_S:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Long_S);
                break;
            case BasicTypeKind::Long_U:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Long_U);
                break;
            case BasicTypeKind::LongLong_S:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::LongLong_S);
                break;
            case BasicTypeKind::LongLong_U:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::LongLong_U);
                break;
            case BasicTypeKind::Bool:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Bool);
                break;
            default:
                PSY_ASSERT_1(false);
                return BasicTypeKind::Int_S;
        }
        if (v <= max)
            return basicTyK;
    }
    return candidates[N-1];
}